

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::GetTargetFlags
          (cmLocalGenerator *this,cmLinkLineComputer *linkLineComputer,string *config,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibs,string *flags,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkFlags,string *frameworkPath,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkPath,cmGeneratorTarget *target)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  int iVar4;
  string *psVar5;
  cmValue cVar6;
  undefined8 *puVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  char *pcVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  string extraLinkFlags;
  string exeFlags;
  string linkLanguage;
  string build;
  string configUpper;
  string local_158;
  string local_138;
  pointer local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  string local_100;
  string local_d0;
  cmComputeLinkInformation *local_b0;
  cmLinkLineComputer *local_a8;
  string local_a0;
  string local_80;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_60;
  string *local_58;
  string local_50;
  
  local_60 = linkLibs;
  local_58 = flags;
  cmsys::SystemTools::UpperCase(&local_80,config);
  local_b0 = cmGeneratorTarget::GetLinkInformation(target,config);
  local_a8 = linkLineComputer;
  (*linkLineComputer->_vptr_cmLinkLineComputer[4])(&local_d0,linkLineComputer,target,config);
  TVar3 = cmGeneratorTarget::GetType(target);
  switch(TVar3) {
  case EXECUTABLE:
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    local_100._M_string_length = 0;
    local_100.field_2._M_allocated_capacity =
         local_100.field_2._M_allocated_capacity & 0xffffffffffffff00;
    iVar4 = std::__cxx11::string::compare((char *)&local_d0);
    if (iVar4 == 0) {
LAB_0044deed:
      AddLanguageFlagsForLinking(this,local_58,target,&local_d0,config);
      if (local_b0 != (cmComputeLinkInformation *)0x0) {
        OutputLinkLibraries(this,local_b0,local_a8,local_60,frameworkPath,linkPath);
      }
      pcVar1 = this->Makefile;
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"BUILD_SHARED_LIBS","");
      bVar2 = cmMakefile::IsOn(pcVar1,&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,
                        (ulong)(local_138.field_2._M_allocated_capacity + 1));
      }
      if (bVar2) {
        std::operator+(&local_158,"CMAKE_SHARED_BUILD_",&local_d0);
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 == paVar8) {
          local_138.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_138.field_2._8_8_ = puVar7[3];
        }
        else {
          local_138.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_138._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_138._M_string_length = puVar7[1];
        *puVar7 = paVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,
                          CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                   local_158.field_2._M_local_buf[0]) + 1);
        }
        psVar5 = cmMakefile::GetSafeDefinition(this->Makefile,&local_138);
        std::__cxx11::string::_M_append((char *)&local_100,(ulong)(psVar5->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,
                          (ulong)(local_138.field_2._M_allocated_capacity + 1));
        }
      }
      GetLinkLibsCMP0065(&local_158,this,&local_d0,target);
      if (local_158._M_string_length != 0) {
        std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_158._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_100);
      }
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"LINK_FLAGS","");
      cVar6 = cmGeneratorTarget::GetProperty(target,&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,
                        (ulong)(local_138.field_2._M_allocated_capacity + 1));
      }
      if (cVar6.Value != (string *)0x0) {
        std::__cxx11::string::_M_append((char *)&local_100,(ulong)((cVar6.Value)->_M_dataplus)._M_p)
        ;
        std::__cxx11::string::append((char *)&local_100);
      }
      if ((pointer)local_80._M_string_length != (pointer)0x0) {
        local_138._M_dataplus._M_p = (pointer)0xb;
        local_138._M_string_length = 0x7dd92b;
        local_138.field_2._M_allocated_capacity = local_80._M_string_length;
        local_138.field_2._8_8_ = local_80._M_dataplus._M_p;
        views_06._M_len = 2;
        views_06._M_array = (iterator)&local_138;
        cmCatViews_abi_cxx11_(&local_a0,views_06);
        cVar6 = cmGeneratorTarget::GetProperty(target,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if (cVar6.Value != (string *)0x0) {
          std::__cxx11::string::_M_append
                    ((char *)&local_100,(ulong)((cVar6.Value)->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&local_100);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_string_length !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   linkFlags,&local_100);
      }
      cmGeneratorTarget::GetLinkOptions
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_138,target,config,&local_d0);
      AppendCompileOptions
                (this,linkFlags,
                 (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_138,(char *)0x0);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,
                        CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                 local_158.field_2._M_local_buf[0]) + 1);
      }
      uVar10 = local_100.field_2._M_allocated_capacity;
      _Var11._M_p = local_100._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p == &local_100.field_2) break;
      goto LAB_0044e242;
    }
    pcVar1 = this->Makefile;
    paVar8 = &local_138.field_2;
    local_138._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"CMAKE_EXE_LINKER_FLAGS","");
    cmMakefile::GetSafeDefinition(pcVar1,&local_138);
    std::__cxx11::string::_M_assign((string *)&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar8) {
      operator_delete(local_138._M_dataplus._M_p,
                      (ulong)(local_138.field_2._M_allocated_capacity + 1));
    }
    std::__cxx11::string::append((char *)&local_100);
    if ((pointer)local_80._M_string_length != (pointer)0x0) {
      pcVar1 = this->Makefile;
      local_138._M_dataplus._M_p = (pointer)0x17;
      local_138._M_string_length = 0x7dd94e;
      local_138.field_2._M_allocated_capacity = local_80._M_string_length;
      local_138.field_2._8_8_ = local_80._M_dataplus._M_p;
      views._M_len = 2;
      views._M_array = (iterator)&local_138;
      cmCatViews_abi_cxx11_(&local_158,views);
      psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_158);
      std::__cxx11::string::_M_append((char *)&local_100,(ulong)(psVar5->_M_dataplus)._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,
                        CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                 local_158.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::append((char *)&local_100);
    }
    if ((pointer)local_d0._M_string_length != (pointer)0x0) {
      bVar2 = cmGeneratorTarget::IsWin32Executable(target,config);
      pcVar1 = this->Makefile;
      if (bVar2) {
        local_138._M_dataplus._M_p = (pointer)0x6;
        local_138._M_string_length = 0x7e2af3;
        local_138.field_2._M_allocated_capacity = local_d0._M_string_length;
        local_138.field_2._8_8_ = local_d0._M_dataplus._M_p;
        local_118 = (pointer)&DAT_00000011;
        local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x7dd966;
        views_00._M_len = 3;
        views_00._M_array = (iterator)&local_138;
        cmCatViews_abi_cxx11_(&local_158,views_00);
        psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_158);
        std::__cxx11::string::_M_append((char *)&local_100,(ulong)(psVar5->_M_dataplus)._M_p);
      }
      else {
        local_138._M_dataplus._M_p = (pointer)0x6;
        local_138._M_string_length = 0x7e2af3;
        local_138.field_2._M_allocated_capacity = local_d0._M_string_length;
        local_138.field_2._8_8_ = local_d0._M_dataplus._M_p;
        local_118 = (pointer)0x13;
        local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x7dd978;
        views_04._M_len = 3;
        views_04._M_array = (iterator)&local_138;
        cmCatViews_abi_cxx11_(&local_158,views_04);
        psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_158);
        std::__cxx11::string::_M_append((char *)&local_100,(ulong)(psVar5->_M_dataplus)._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,
                        CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                 local_158.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::append((char *)&local_100);
      bVar2 = cmGeneratorTarget::IsExecutableWithExports(target);
      if (bVar2) {
        pcVar1 = this->Makefile;
        local_138._M_dataplus._M_p = (pointer)0x12;
        local_138._M_string_length = 0x7dd98c;
        local_138.field_2._M_allocated_capacity = local_d0._M_string_length;
        local_138.field_2._8_8_ = local_d0._M_dataplus._M_p;
        local_118 = (pointer)0x5;
        local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x7c1c01;
        views_05._M_len = 3;
        views_05._M_array = (iterator)&local_138;
        cmCatViews_abi_cxx11_(&local_158,views_05);
        psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_158);
        std::__cxx11::string::_M_append((char *)&local_100,(ulong)(psVar5->_M_dataplus)._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,
                          CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                   local_158.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::string::append((char *)&local_100);
      }
      goto LAB_0044deed;
    }
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    std::operator+(&local_138,"CMake can not determine linker language for target: ",psVar5);
    cmSystemTools::Error(&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar8) {
      operator_delete(local_138._M_dataplus._M_p,
                      (ulong)(local_138.field_2._M_allocated_capacity + 1));
    }
    uVar10 = local_100.field_2._M_allocated_capacity;
    _Var11._M_p = local_100._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p == &local_100.field_2) goto LAB_0044e2db;
    goto LAB_0044e2d3;
  case STATIC_LIBRARY:
    GetStaticLibraryFlags
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_100,this,config,&local_d0,target);
    local_138._M_dataplus._M_p =
         (pointer)(linkFlags->
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    local_138._M_string_length =
         (size_type)
         (linkFlags->
         super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_138.field_2._M_allocated_capacity =
         (size_type)
         (linkFlags->
         super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (linkFlags->
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)local_100._M_dataplus._M_p;
    (linkFlags->
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_100._M_string_length;
    (linkFlags->
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_100.field_2._M_allocated_capacity;
    local_100._M_dataplus._M_p = (pointer)0x0;
    local_100._M_string_length = 0;
    local_100.field_2._M_allocated_capacity = 0;
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_138);
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_100);
    break;
  case SHARED_LIBRARY:
    pcVar9 = "CMAKE_SHARED_LINKER_FLAGS";
    goto LAB_0044d988;
  case MODULE_LIBRARY:
    pcVar9 = "CMAKE_MODULE_LINKER_FLAGS";
LAB_0044d988:
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    local_158._M_string_length = 0;
    local_158.field_2._M_local_buf[0] = '\0';
    iVar4 = std::__cxx11::string::compare((char *)&local_d0);
    if (iVar4 != 0) {
      pcVar1 = this->Makefile;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pcVar9,(char *)((long)pcVar9 + 0x19));
      psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_50);
      local_100._M_string_length = (size_type)(psVar5->_M_dataplus)._M_p;
      local_100._M_dataplus._M_p = (pointer)psVar5->_M_string_length;
      local_138._M_string_length = (size_type)&local_138.field_2;
      local_138._M_dataplus._M_p = &DAT_00000001;
      local_138.field_2._M_local_buf[0] = 0x20;
      local_100.field_2._M_allocated_capacity = (size_type)&DAT_00000001;
      views_01._M_len = 2;
      views_01._M_array = (iterator)&local_100;
      local_100.field_2._8_8_ = local_138._M_string_length;
      cmCatViews_abi_cxx11_(&local_a0,views_01);
      std::__cxx11::string::operator=((string *)&local_158,(string *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_80._M_string_length != (pointer)0x0) {
        local_138.field_2._8_8_ = &local_100.field_2;
        local_100._M_dataplus._M_p = &DAT_00000001;
        local_100.field_2._M_local_buf[0] = 0x5f;
        local_138._M_dataplus._M_p = (pointer)0x19;
        local_138.field_2._M_allocated_capacity = (size_type)&DAT_00000001;
        local_118 = (pointer)local_80._M_string_length;
        local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_80._M_dataplus._M_p;
        views_02._M_len = 3;
        views_02._M_array = (iterator)&local_138;
        local_138._M_string_length = (size_type)pcVar9;
        local_100._M_string_length = local_138.field_2._8_8_;
        cmCatViews_abi_cxx11_(&local_a0,views_02);
        psVar5 = cmMakefile::GetSafeDefinition(this->Makefile,&local_a0);
        std::__cxx11::string::_M_append((char *)&local_158,(ulong)(psVar5->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
    }
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"LINK_FLAGS","");
    cVar6 = cmGeneratorTarget::GetProperty(target,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,
                      (ulong)(local_138.field_2._M_allocated_capacity + 1));
    }
    if (cVar6.Value != (string *)0x0) {
      std::__cxx11::string::_M_append((char *)&local_158,(ulong)((cVar6.Value)->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_158);
    }
    if ((pointer)local_80._M_string_length != (pointer)0x0) {
      local_138._M_dataplus._M_p = (pointer)0xb;
      local_138._M_string_length = 0x7dd92b;
      local_138.field_2._M_allocated_capacity = local_80._M_string_length;
      local_138.field_2._8_8_ = local_80._M_dataplus._M_p;
      views_03._M_len = 2;
      views_03._M_array = (iterator)&local_138;
      cmCatViews_abi_cxx11_(&local_100,views_03);
      cVar6 = cmGeneratorTarget::GetProperty(target,&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,
                        (ulong)(local_100.field_2._M_allocated_capacity + 1));
      }
      if (cVar6.Value != (string *)0x0) {
        std::__cxx11::string::_M_append((char *)&local_158,(ulong)((cVar6.Value)->_M_dataplus)._M_p)
        ;
        std::__cxx11::string::append((char *)&local_158);
      }
    }
    if (local_158._M_string_length != 0) {
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<std::__cxx11::string>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 linkFlags,&local_158);
    }
    cmGeneratorTarget::GetLinkOptions
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_138,target,config,&local_d0);
    AppendCompileOptions
              (this,linkFlags,
               (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_138,(char *)0x0);
    if (local_b0 != (cmComputeLinkInformation *)0x0) {
      OutputLinkLibraries(this,local_b0,local_a8,local_60,frameworkPath,linkPath);
    }
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      uVar10 = (pointer)CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                 local_158.field_2._M_local_buf[0]);
      _Var11._M_p = local_158._M_dataplus._M_p;
LAB_0044e242:
      operator_delete(_Var11._M_p,(ulong)((long)&(((pointer)uVar10)->Value)._M_dataplus._M_p + 1));
    }
  }
  local_138._M_string_length = 0;
  local_138.field_2._M_allocated_capacity =
       local_138.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  AppendPositionIndependentLinkerFlags(this,&local_138,target,config,&local_d0);
  AppendIPOLinkerFlags(this,&local_138,target,config,&local_d0);
  AppendModuleDefinitionFlag(this,&local_138,target,local_a8,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_string_length !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               linkFlags,&local_138);
  }
  uVar10 = local_138.field_2._M_allocated_capacity;
  _Var11._M_p = local_138._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
LAB_0044e2d3:
    operator_delete(_Var11._M_p,(ulong)((long)&(((pointer)uVar10)->Value)._M_dataplus._M_p + 1));
  }
LAB_0044e2db:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::GetTargetFlags(
  cmLinkLineComputer* linkLineComputer, const std::string& config,
  std::vector<BT<std::string>>& linkLibs, std::string& flags,
  std::vector<BT<std::string>>& linkFlags, std::string& frameworkPath,
  std::vector<BT<std::string>>& linkPath, cmGeneratorTarget* target)
{
  const std::string configUpper = cmSystemTools::UpperCase(config);
  cmComputeLinkInformation* pcli = target->GetLinkInformation(config);
  const char* libraryLinkVariable =
    "CMAKE_SHARED_LINKER_FLAGS"; // default to shared library

  const std::string linkLanguage =
    linkLineComputer->GetLinkerLanguage(target, config);

  switch (target->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      linkFlags = this->GetStaticLibraryFlags(config, linkLanguage, target);
      break;
    case cmStateEnums::MODULE_LIBRARY:
      libraryLinkVariable = "CMAKE_MODULE_LINKER_FLAGS";
      CM_FALLTHROUGH;
    case cmStateEnums::SHARED_LIBRARY: {
      std::string sharedLibFlags;
      if (linkLanguage != "Swift") {
        sharedLibFlags = cmStrCat(
          this->Makefile->GetSafeDefinition(libraryLinkVariable), ' ');
        if (!configUpper.empty()) {
          std::string build = cmStrCat(libraryLinkVariable, '_', configUpper);
          sharedLibFlags += this->Makefile->GetSafeDefinition(build);
          sharedLibFlags += " ";
        }
      }

      cmValue targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        sharedLibFlags += *targetLinkFlags;
        sharedLibFlags += " ";
      }
      if (!configUpper.empty()) {
        targetLinkFlags =
          target->GetProperty(cmStrCat("LINK_FLAGS_", configUpper));
        if (targetLinkFlags) {
          sharedLibFlags += *targetLinkFlags;
          sharedLibFlags += " ";
        }
      }

      if (!sharedLibFlags.empty()) {
        linkFlags.emplace_back(std::move(sharedLibFlags));
      }

      std::vector<BT<std::string>> linkOpts =
        target->GetLinkOptions(config, linkLanguage);
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, linkOpts);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }
    } break;
    case cmStateEnums::EXECUTABLE: {
      std::string exeFlags;
      if (linkLanguage != "Swift") {
        exeFlags = this->Makefile->GetSafeDefinition("CMAKE_EXE_LINKER_FLAGS");
        exeFlags += " ";
        if (!configUpper.empty()) {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_EXE_LINKER_FLAGS_", configUpper));
          exeFlags += " ";
        }
        if (linkLanguage.empty()) {
          cmSystemTools::Error(
            "CMake can not determine linker language for target: " +
            target->GetName());
          return;
        }

        if (target->IsWin32Executable(config)) {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_", linkLanguage, "_CREATE_WIN32_EXE"));
          exeFlags += " ";
        } else {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_", linkLanguage, "_CREATE_CONSOLE_EXE"));
          exeFlags += " ";
        }

        if (target->IsExecutableWithExports()) {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_EXE_EXPORTS_", linkLanguage, "_FLAG"));
          exeFlags += " ";
        }
      }

      this->AddLanguageFlagsForLinking(flags, target, linkLanguage, config);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }

      if (this->Makefile->IsOn("BUILD_SHARED_LIBS")) {
        std::string sFlagVar = "CMAKE_SHARED_BUILD_" + linkLanguage + "_FLAGS";
        exeFlags += this->Makefile->GetSafeDefinition(sFlagVar);
        exeFlags += " ";
      }

      std::string cmp0065Flags =
        this->GetLinkLibsCMP0065(linkLanguage, *target);
      if (!cmp0065Flags.empty()) {
        exeFlags += cmp0065Flags;
        exeFlags += " ";
      }

      cmValue targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        exeFlags += *targetLinkFlags;
        exeFlags += " ";
      }
      if (!configUpper.empty()) {
        targetLinkFlags =
          target->GetProperty(cmStrCat("LINK_FLAGS_", configUpper));
        if (targetLinkFlags) {
          exeFlags += *targetLinkFlags;
          exeFlags += " ";
        }
      }

      if (!exeFlags.empty()) {
        linkFlags.emplace_back(std::move(exeFlags));
      }

      std::vector<BT<std::string>> linkOpts =
        target->GetLinkOptions(config, linkLanguage);
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, linkOpts);
    } break;
    default:
      break;
  }

  std::string extraLinkFlags;
  this->AppendPositionIndependentLinkerFlags(extraLinkFlags, target, config,
                                             linkLanguage);
  this->AppendIPOLinkerFlags(extraLinkFlags, target, config, linkLanguage);
  this->AppendModuleDefinitionFlag(extraLinkFlags, target, linkLineComputer,
                                   config);

  if (!extraLinkFlags.empty()) {
    linkFlags.emplace_back(std::move(extraLinkFlags));
  }
}